

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

bool duckdb::ExternalThreadsSetting::OnGlobalSet(DatabaseInstance *db,DBConfig *config,Value *input)

{
  int64_t val;
  unsigned_long external_threads;
  TaskScheduler *this;
  SyntaxException *this_00;
  allocator local_41;
  string local_40;
  
  val = Value::GetValue<long>(input);
  if (-1 < val) {
    external_threads = NumericCastImpl<unsigned_long,_long,_false>::Convert(val);
    if (db != (DatabaseInstance *)0x0) {
      this = TaskScheduler::GetScheduler(db);
      TaskScheduler::SetThreads(this,(config->options).maximum_threads,external_threads);
    }
    return true;
  }
  this_00 = (SyntaxException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,"Must have a non-negative number of external threads!",&local_41);
  SyntaxException::SyntaxException(this_00,&local_40);
  __cxa_throw(this_00,&SyntaxException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool ExternalThreadsSetting::OnGlobalSet(DatabaseInstance *db, DBConfig &config, const Value &input) {
	auto new_val = input.GetValue<int64_t>();
	if (new_val < 0) {
		throw SyntaxException("Must have a non-negative number of external threads!");
	}
	auto new_external_threads = NumericCast<idx_t>(new_val);
	if (db) {
		TaskScheduler::GetScheduler(*db).SetThreads(config.options.maximum_threads, new_external_threads);
	}
	return true;
}